

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chests.c
# Opt level: O3

BOOL is_quest_item(uint8_t item)

{
  BOOL BVar1;
  
  BVar1 = FALSE;
  if ((byte)(item - 10) < 7) {
    BVar1 = (&DAT_00177070)[(byte)(item - 10)];
  }
  return BVar1;
}

Assistant:

BOOL is_quest_item(uint8_t item)
{
    switch(item) {
        case TOKEN:
        case STONES:
        case HARP:
        case STAFF:
            return TRUE;
        default:
            return FALSE;
    }
}